

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to16.h
# Opt level: O0

void ncnn::im2col_sgemm_pack8to16_avx512
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [24];
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m512 _val0_1;
  __m512 _w0_1;
  int j_1;
  __m512 _sum0_1;
  int nn_1;
  float *kptr_1;
  float *tmpptr_3;
  __m512 _val7;
  __m512 _val6;
  __m512 _val5;
  __m512 _val4;
  __m512 _val3;
  __m512 _val2;
  __m512 _val1;
  __m512 _val0;
  __m512 _w0;
  int j;
  __m512 _sum7;
  __m512 _sum6;
  __m512 _sum5;
  __m512 _sum4;
  __m512 _sum3;
  __m512 _sum2;
  __m512 _sum1;
  __m512 _sum0;
  int nn;
  float *kptr;
  float *tmpptr_2;
  int i_2;
  float *biasptr;
  float zeros [16];
  float *outptr0;
  int p;
  __m256 _val;
  int k_1;
  float *img0_1;
  int q_1;
  float *tmpptr_1;
  int i_1;
  __m256 _r7;
  __m256 _r6;
  __m256 _r5;
  __m256 _r4;
  __m256 _r3;
  __m256 _r2;
  __m256 _r1;
  __m256 _r0;
  int k;
  float *img0;
  int q;
  float *tmpptr;
  int i;
  int ii;
  int remain_size_start;
  int nn_size;
  Mat tmp;
  float *bias;
  int outch;
  int inch;
  int maxk;
  int size;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_8;
  Mat *m_6;
  Mat *m_3;
  Mat *m_1;
  __m256 __tt7;
  __m256 __tt6;
  __m256 __tt5;
  __m256 __tt4;
  __m256 __tt3;
  __m256 __tt2;
  __m256 __tt1;
  __m256 __tt0;
  __m256 __t7;
  __m256 __t6;
  __m256 __t5;
  __m256 __t4;
  __m256 __t3;
  __m256 __t2;
  __m256 __t1;
  __m256 __t0;
  int in_stack_ffffffffffffd3dc;
  size_t in_stack_ffffffffffffd3e0;
  int in_stack_ffffffffffffd3ec;
  int in_stack_ffffffffffffd3f0;
  int in_stack_ffffffffffffd3f4;
  Mat *in_stack_ffffffffffffd3f8;
  Allocator *in_stack_ffffffffffffd458;
  undefined1 (*local_2b50) [64];
  int local_2884;
  undefined1 local_2880 [64];
  undefined8 local_2820;
  undefined8 local_2818;
  undefined8 local_2810;
  undefined4 local_2808;
  long local_2800;
  undefined4 local_27f8;
  undefined4 local_27f4;
  undefined4 local_27f0;
  undefined4 local_27ec;
  undefined4 local_27e8;
  undefined8 local_27e0;
  undefined1 (*local_27d8) [64];
  undefined8 local_27d0;
  undefined8 local_27c8;
  undefined8 local_27c0;
  undefined4 local_27b8;
  long *local_27b0;
  undefined4 local_27a8;
  undefined4 local_27a4;
  undefined4 local_27a0;
  undefined4 local_279c;
  undefined4 local_2798;
  undefined8 local_2790;
  uint *local_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 uStack_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 uStack_26b0;
  undefined8 uStack_26a8;
  undefined8 uStack_26a0;
  undefined8 uStack_2698;
  undefined8 uStack_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 uStack_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  int local_2504;
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined1 local_2440 [64];
  undefined1 local_2400 [64];
  undefined1 local_23c0 [64];
  undefined1 local_2380 [64];
  undefined1 local_2340 [64];
  int local_22f4;
  undefined8 local_22f0;
  undefined8 local_22e8;
  undefined8 local_22e0;
  undefined4 local_22d8;
  long local_22d0;
  undefined4 local_22c8;
  undefined4 local_22c4;
  undefined4 local_22c0;
  undefined4 local_22bc;
  undefined4 local_22b8;
  undefined8 local_22b0;
  undefined1 (*local_22a8) [64];
  undefined8 local_22a0;
  undefined8 local_2298;
  undefined8 local_2290;
  undefined4 local_2288;
  long *local_2280;
  undefined4 local_2278;
  undefined4 local_2274;
  undefined4 local_2270;
  undefined4 local_226c;
  undefined4 local_2268;
  undefined8 local_2260;
  uint *local_2258;
  int local_224c;
  undefined1 (*local_2248) [64];
  undefined1 local_2240 [72];
  undefined8 local_21f8;
  undefined8 local_21f0;
  undefined8 local_21e8;
  undefined4 local_21e0;
  long local_21d8;
  undefined4 local_21d0;
  undefined4 local_21cc;
  undefined4 local_21c8;
  undefined4 local_21c4;
  undefined4 local_21c0;
  undefined8 local_21b8;
  undefined8 *local_21b0;
  int local_21a4;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  int local_2174;
  undefined8 local_2170;
  undefined8 local_2168;
  undefined8 local_2160;
  undefined4 local_2158;
  long local_2150;
  undefined4 local_2148;
  undefined4 local_2144;
  undefined4 local_2140;
  undefined4 local_213c;
  undefined4 local_2138;
  undefined8 local_2130;
  undefined8 *local_2128;
  int local_211c;
  undefined8 local_2118;
  undefined8 local_2110;
  undefined8 local_2108;
  undefined4 local_2100;
  long *local_20f8;
  undefined4 local_20f0;
  undefined4 local_20ec;
  undefined4 local_20e8;
  undefined4 local_20e4;
  undefined4 local_20e0;
  undefined8 local_20d8;
  undefined8 *local_20d0;
  int local_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 local_1fe0 [32];
  int local_1fb4;
  undefined8 local_1fb0;
  undefined8 local_1fa8;
  undefined8 local_1fa0;
  undefined4 local_1f98;
  long local_1f90;
  undefined4 local_1f88;
  undefined4 local_1f84;
  undefined4 local_1f80;
  undefined4 local_1f7c;
  undefined4 local_1f78;
  undefined8 local_1f70;
  undefined1 (*local_1f68) [32];
  int local_1f5c;
  undefined8 local_1f58;
  undefined8 local_1f50;
  undefined8 local_1f48;
  undefined4 local_1f40;
  long *local_1f38;
  undefined4 local_1f30;
  undefined4 local_1f2c;
  undefined4 local_1f28;
  undefined4 local_1f24;
  undefined4 local_1f20;
  undefined8 local_1f18;
  undefined8 *local_1f10;
  int local_1f04;
  int local_1f00;
  int local_1efc;
  int local_1ef8;
  void *local_1ee8;
  int *local_1ee0;
  long local_1ed8;
  undefined4 local_1ed0;
  long *local_1ec8;
  undefined4 local_1ec0;
  int local_1ebc;
  int local_1eb8;
  undefined4 local_1eb4;
  undefined4 local_1eb0;
  long local_1ea8;
  long local_1ea0;
  int local_1e98;
  int local_1e94;
  int local_1e90;
  int local_1e8c;
  long *local_1e78;
  long *local_1e70;
  long *local_1e68;
  void **local_1e60;
  undefined8 *local_1e58;
  undefined8 *local_1e48;
  undefined8 *local_1e38;
  undefined8 *local_1e28;
  undefined8 *local_1e18;
  undefined8 *local_1e08;
  undefined8 *local_1df8;
  undefined8 *local_1de8;
  undefined8 *local_1dd8;
  void **local_1dc8;
  int local_1da8;
  undefined4 local_1da4;
  void **local_1da0;
  undefined8 *local_1d80;
  undefined8 *local_1d60;
  undefined8 *local_1d40;
  undefined8 *local_1d20;
  undefined8 *local_1d00;
  undefined8 *local_1ce0;
  undefined8 *local_1cc0;
  undefined8 *local_1ca0;
  undefined8 *local_1c80;
  undefined1 local_1c75;
  int local_1c74;
  void **local_1c70;
  undefined8 *local_1c68;
  undefined1 local_1c45;
  int local_1c44;
  void **local_1c40;
  undefined8 *local_1c38;
  undefined1 local_1c15;
  int local_1c14;
  undefined8 *local_1c08;
  undefined1 local_1be5;
  int local_1be4;
  void **local_1be0;
  undefined8 *local_1bd8;
  undefined1 local_1bb5;
  int local_1bb4;
  void **local_1bb0;
  undefined8 *local_1ba8;
  undefined8 *local_1b88;
  undefined8 *local_1b80;
  undefined8 *local_1b78;
  undefined8 *local_1b70;
  undefined8 *local_1b68;
  undefined8 *local_1b60;
  undefined8 *local_1b58;
  undefined8 *local_1b50;
  undefined8 *local_1b48;
  undefined1 local_1b35;
  int local_1b34;
  undefined8 *local_1b28;
  undefined1 local_1b05;
  int local_1b04;
  undefined8 *local_1af8;
  undefined1 local_1ad5;
  int local_1ad4;
  undefined8 *local_1ac8;
  undefined1 local_1aa5;
  int local_1aa4;
  undefined8 *local_1a98;
  void *local_19a0;
  undefined1 (*local_1990) [64];
  undefined1 (*local_1988) [64];
  undefined1 local_1980 [64];
  uint local_1904;
  undefined1 local_1900 [64];
  uint local_1884;
  undefined1 local_1880 [64];
  uint local_1804;
  undefined1 local_1800 [64];
  uint local_1784;
  undefined1 local_1780 [64];
  uint local_1704;
  undefined1 local_1700 [64];
  uint local_1684;
  undefined1 local_1680 [64];
  uint local_1604;
  undefined1 local_1600 [64];
  uint local_1584;
  undefined1 local_1580 [64];
  uint local_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 uStack_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 uStack_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 uStack_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 uStack_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 uStack_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 uStack_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 uStack_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 uStack_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 uStack_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 uStack_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 uStack_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 uStack_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 uStack_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 uStack_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 uStack_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 uStack_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 uStack_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 uStack_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 uStack_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 uStack_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 uStack_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 uStack_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 uStack_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 uStack_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 uStack_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 uStack_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined1 (*local_e10) [64];
  undefined1 (*local_e08) [64];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 uStack_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 *local_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 uStack_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 *local_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 uStack_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 *local_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 uStack_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 *local_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 uStack_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 *local_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 uStack_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 *local_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 uStack_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 *local_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 uStack_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined1 (*local_9a0) [32];
  undefined1 (*local_998) [32];
  undefined1 (*local_990) [32];
  undefined1 (*local_988) [32];
  undefined1 (*local_980) [32];
  undefined1 (*local_978) [32];
  undefined1 (*local_970) [32];
  undefined1 (*local_968) [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined8 *local_760;
  undefined8 *local_758;
  undefined8 *local_750;
  undefined8 *local_748;
  undefined8 *local_740;
  undefined8 *local_738;
  undefined8 *local_730;
  undefined1 *local_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 *local_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 *local_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 *local_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 *local_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 *local_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  long local_2d8;
  undefined4 local_2cc;
  long local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 *local_2a8;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  long local_288;
  undefined4 local_27c;
  int local_278;
  int local_274;
  undefined8 *local_270;
  long local_268;
  undefined4 local_25c;
  long local_258;
  undefined1 (*local_250) [64];
  undefined4 local_244;
  int local_240;
  int local_23c;
  undefined8 *local_238;
  long local_230;
  undefined4 local_224;
  long local_220;
  undefined1 (*local_218) [64];
  undefined4 local_20c;
  int local_208;
  int local_204;
  undefined8 *local_200;
  long *local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined8 *local_1e0;
  undefined4 local_1d4;
  int local_1d0;
  int local_1cc;
  undefined8 *local_1c8;
  long *local_1c0;
  undefined4 local_1b4;
  long local_1b0;
  undefined8 *local_1a8;
  undefined4 local_19c;
  int local_198;
  int local_194;
  undefined8 *local_190;
  long local_188;
  undefined4 local_17c;
  long local_178;
  undefined8 *local_170;
  undefined4 local_164;
  int local_160;
  int local_15c;
  undefined8 *local_158;
  long *local_150;
  undefined4 local_144;
  long local_140;
  uint *local_138;
  undefined4 local_12c;
  int local_128;
  int local_124;
  undefined8 *local_120;
  long *local_118;
  undefined4 local_10c;
  long local_108;
  uint *local_100;
  undefined4 local_f4;
  int local_f0;
  int local_ec;
  undefined8 *local_e8;
  undefined4 local_dc;
  long local_d8;
  undefined4 local_cc;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  
  local_1e8c = *(int *)((long)in_RDI + 0x2c);
  local_1e90 = (int)in_RDI[6];
  local_1e94 = (int)in_RDI[7];
  local_1e98 = (int)in_RSI[7];
  local_1ea0 = *in_RCX;
  local_1e60 = &local_1ee8;
  local_1ee8 = (void *)0x0;
  local_1ee0 = (int *)0x0;
  local_1ed8 = 0;
  local_1ed0 = 0;
  local_1ec8 = (long *)0x0;
  local_1ec0 = 0;
  local_1ebc = 0;
  local_1eb8 = 0;
  local_1eb4 = 0;
  local_1eb0 = 0;
  local_1ea8 = 0;
  local_1e78 = in_RDX;
  local_1e70 = in_RSI;
  local_1e68 = in_RDI;
  if (local_1e8c < 8) {
    Mat::create(in_stack_ffffffffffffd3f8,in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0,
                in_stack_ffffffffffffd3ec,in_stack_ffffffffffffd3e0,in_stack_ffffffffffffd3dc,
                in_stack_ffffffffffffd458);
  }
  else {
    Mat::create(in_stack_ffffffffffffd3f8,in_stack_ffffffffffffd3f4,in_stack_ffffffffffffd3f0,
                in_stack_ffffffffffffd3ec,in_stack_ffffffffffffd3e0,in_stack_ffffffffffffd3dc,
                in_stack_ffffffffffffd458);
  }
  local_1ef8 = local_1e8c >> 3;
  for (local_1f00 = 0; local_1f00 < local_1ef8; local_1f00 = local_1f00 + 1) {
    local_1f04 = local_1f00 * 8;
    local_1bb4 = local_1f04 / 8;
    local_1ba8 = &local_1f58;
    local_1bb0 = &local_1ee8;
    local_1e0 = (undefined8 *)((long)local_1ee8 + local_1ea8 * local_1bb4 * local_1ed8);
    local_1c8 = &local_1f58;
    local_98 = (long)local_1ebc * (long)local_1eb8 * local_1ed8;
    local_1b68 = &local_1f58;
    local_1e58 = &local_1f58;
    local_1f38 = local_1ec8;
    local_9c = 0x10;
    local_1cc = local_1ebc;
    local_1d0 = local_1eb8;
    local_1d4 = local_1eb4;
    local_1e8 = local_1ed8;
    local_1ec = local_1ed0;
    local_1f8 = local_1ec8;
    local_1bb5 = 1;
    local_1f58 = 0;
    local_1f48 = 0;
    local_1f40 = 0;
    local_1f30 = 0;
    local_1f2c = 0;
    local_1f28 = 0;
    local_1f24 = 0;
    local_1f20 = 0;
    local_1f18 = 0;
    local_1f50 = 0;
    local_1f10 = local_1e0;
    for (local_1f5c = 0; local_1f5c < local_1e94; local_1f5c = local_1f5c + 1) {
      local_1a98 = &local_1fb0;
      local_2ac = *(int *)((long)local_1e68 + 0x2c);
      local_2b0 = (int)local_1e68[6];
      local_2b4 = *(undefined4 *)((long)local_1e68 + 0x34);
      local_2c0 = *local_1e68 + local_1e68[8] * (long)local_1f5c * local_1e68[2];
      local_2c8 = local_1e68[2];
      local_2cc = (undefined4)local_1e68[3];
      local_2d8 = local_1e68[4];
      local_2a8 = &local_1fb0;
      local_58 = (long)local_2ac * (long)local_2b0 * local_2c8;
      local_1b48 = &local_1fb0;
      local_1f68 = (undefined1 (*) [32])(local_2c0 + (long)(local_1f00 << 6) * 4);
      local_1e48 = &local_1fb0;
      local_5c = 0x10;
      local_1aa4 = local_1f5c;
      local_1aa5 = 1;
      local_1fb0 = 0;
      local_1fa0 = 0;
      local_1f98 = 0;
      local_1f88 = 0;
      local_1f84 = 0;
      local_1f80 = 0;
      local_1f7c = 0;
      local_1f78 = 0;
      local_1f70 = 0;
      local_1fa8 = 0;
      for (local_1fb4 = 0; local_1fb4 < local_1e90; local_1fb4 = local_1fb4 + 1) {
        local_968 = local_1f68;
        auVar2 = *(undefined1 (*) [24])*local_1f68;
        uStack_3e8 = *(undefined8 *)(*local_1f68 + 0x18);
        local_970 = local_1f68 + 1;
        local_420 = *(undefined8 *)*local_970;
        uStack_418 = *(undefined8 *)(local_1f68[1] + 8);
        uStack_410 = *(undefined8 *)(local_1f68[1] + 0x10);
        uStack_408 = *(undefined8 *)(local_1f68[1] + 0x18);
        local_978 = local_1f68 + 2;
        local_440 = *(undefined8 *)*local_978;
        uStack_438 = *(undefined8 *)(local_1f68[2] + 8);
        uStack_430 = *(undefined8 *)(local_1f68[2] + 0x10);
        uStack_428 = *(undefined8 *)(local_1f68[2] + 0x18);
        local_980 = local_1f68 + 3;
        local_460 = *(undefined8 *)*local_980;
        uStack_458 = *(undefined8 *)(local_1f68[3] + 8);
        uStack_450 = *(undefined8 *)(local_1f68[3] + 0x10);
        uStack_448 = *(undefined8 *)(local_1f68[3] + 0x18);
        local_988 = local_1f68 + 4;
        local_480 = *(undefined8 *)*local_988;
        uStack_478 = *(undefined8 *)(local_1f68[4] + 8);
        uStack_470 = *(undefined8 *)(local_1f68[4] + 0x10);
        uStack_468 = *(undefined8 *)(local_1f68[4] + 0x18);
        local_990 = local_1f68 + 5;
        local_4a0 = *(undefined8 *)*local_990;
        uStack_498 = *(undefined8 *)(local_1f68[5] + 8);
        uStack_490 = *(undefined8 *)(local_1f68[5] + 0x10);
        uStack_488 = *(undefined8 *)(local_1f68[5] + 0x18);
        local_998 = local_1f68 + 6;
        local_4c0 = *(undefined8 *)*local_998;
        uStack_4b8 = *(undefined8 *)(local_1f68[6] + 8);
        uStack_4b0 = *(undefined8 *)(local_1f68[6] + 0x10);
        uStack_4a8 = *(undefined8 *)(local_1f68[6] + 0x18);
        local_9a0 = local_1f68 + 7;
        local_4e0 = *(undefined8 *)*local_9a0;
        uStack_4d8 = *(undefined8 *)(local_1f68[7] + 8);
        uStack_4d0 = *(undefined8 *)(local_1f68[7] + 0x10);
        uStack_4c8 = *(undefined8 *)(local_1f68[7] + 0x18);
        local_728 = local_1fe0;
        local_730 = &local_2000;
        local_738 = &local_2020;
        local_740 = &local_2040;
        local_748 = &local_2060;
        local_750 = &local_2080;
        local_758 = &local_20a0;
        local_760 = &local_20c0;
        local_1fe0._0_8_ = auVar2._0_8_;
        local_400 = local_1fe0._0_8_;
        local_1fe0._8_8_ = auVar2._8_8_;
        uStack_3f8 = local_1fe0._8_8_;
        local_1fe0._16_8_ = auVar2._16_8_;
        uStack_3f0 = local_1fe0._16_8_;
        local_780 = vunpcklps_avx(*local_1f68,*local_970);
        local_300 = local_1fe0._0_8_;
        uStack_2f8 = local_1fe0._8_8_;
        uStack_2f0 = local_1fe0._16_8_;
        local_7a0 = vunpckhps_avx(*local_1f68,*local_970);
        local_7c0 = vunpcklps_avx(*local_978,*local_980);
        local_7e0 = vunpckhps_avx(*local_978,*local_980);
        local_800 = vunpcklps_avx(*local_988,*local_990);
        local_820 = vunpckhps_avx(*local_988,*local_990);
        local_840 = vunpcklps_avx(*local_998,*local_9a0);
        local_860 = vunpckhps_avx(*local_998,*local_9a0);
        local_880 = vunpcklpd_avx(local_780,local_7c0);
        local_8a0 = vunpckhpd_avx(local_780,local_7c0);
        local_8c0 = vunpcklpd_avx(local_7a0,local_7e0);
        local_8e0 = vunpckhpd_avx(local_7a0,local_7e0);
        local_900 = vunpcklpd_avx(local_800,local_840);
        local_920 = vunpckhpd_avx(local_800,local_840);
        local_940 = vunpcklpd_avx(local_820,local_860);
        local_960 = vunpckhpd_avx(local_820,local_860);
        local_1fe0 = vperm2f128_avx(local_880,local_900,0x20);
        auVar1 = vperm2f128_avx(local_8a0,local_920,0x20);
        uStack_1fe8 = auVar1._24_8_;
        uStack_1ff0 = auVar1._16_8_;
        uStack_1ff8 = auVar1._8_8_;
        local_2000 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_8c0,local_940,0x20);
        uStack_2008 = auVar1._24_8_;
        uStack_2010 = auVar1._16_8_;
        uStack_2018 = auVar1._8_8_;
        local_2020 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_8e0,local_960,0x20);
        uStack_2028 = auVar1._24_8_;
        uStack_2030 = auVar1._16_8_;
        uStack_2038 = auVar1._8_8_;
        local_2040 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_880,local_900,0x31);
        uStack_2048 = auVar1._24_8_;
        uStack_2050 = auVar1._16_8_;
        uStack_2058 = auVar1._8_8_;
        local_2060 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_8a0,local_920,0x31);
        uStack_2068 = auVar1._24_8_;
        uStack_2070 = auVar1._16_8_;
        uStack_2078 = auVar1._8_8_;
        local_2080 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_8c0,local_940,0x31);
        uStack_2088 = auVar1._24_8_;
        uStack_2090 = auVar1._16_8_;
        uStack_2098 = auVar1._8_8_;
        local_20a0 = auVar1._0_8_;
        auVar1 = vperm2f128_avx(local_8e0,local_960,0x31);
        uStack_20a8 = auVar1._24_8_;
        uStack_20b0 = auVar1._16_8_;
        uStack_20b8 = auVar1._8_8_;
        local_20c0 = auVar1._0_8_;
        local_4e8 = local_1f10;
        local_520 = local_1fe0._0_8_;
        uStack_518 = local_1fe0._8_8_;
        uStack_510 = local_1fe0._16_8_;
        uStack_508 = local_1fe0._24_8_;
        *local_1f10 = local_1fe0._0_8_;
        local_1f10[1] = local_1fe0._8_8_;
        local_1f10[2] = local_1fe0._16_8_;
        local_1f10[3] = local_1fe0._24_8_;
        local_528 = local_1f10 + 4;
        local_560 = local_2000;
        uStack_558 = uStack_1ff8;
        uStack_550 = uStack_1ff0;
        uStack_548 = uStack_1fe8;
        *local_528 = local_2000;
        local_1f10[5] = uStack_1ff8;
        local_1f10[6] = uStack_1ff0;
        local_1f10[7] = uStack_1fe8;
        local_568 = local_1f10 + 8;
        local_5a0 = local_2020;
        uStack_598 = uStack_2018;
        uStack_590 = uStack_2010;
        uStack_588 = uStack_2008;
        *local_568 = local_2020;
        local_1f10[9] = uStack_2018;
        local_1f10[10] = uStack_2010;
        local_1f10[0xb] = uStack_2008;
        local_5a8 = local_1f10 + 0xc;
        local_5e0 = local_2040;
        uStack_5d8 = uStack_2038;
        uStack_5d0 = uStack_2030;
        uStack_5c8 = uStack_2028;
        *local_5a8 = local_2040;
        local_1f10[0xd] = uStack_2038;
        local_1f10[0xe] = uStack_2030;
        local_1f10[0xf] = uStack_2028;
        local_5e8 = local_1f10 + 0x10;
        local_620 = local_2060;
        uStack_618 = uStack_2058;
        uStack_610 = uStack_2050;
        uStack_608 = uStack_2048;
        *local_5e8 = local_2060;
        local_1f10[0x11] = uStack_2058;
        local_1f10[0x12] = uStack_2050;
        local_1f10[0x13] = uStack_2048;
        local_628 = local_1f10 + 0x14;
        local_660 = local_2080;
        uStack_658 = uStack_2078;
        uStack_650 = uStack_2070;
        uStack_648 = uStack_2068;
        *local_628 = local_2080;
        local_1f10[0x15] = uStack_2078;
        local_1f10[0x16] = uStack_2070;
        local_1f10[0x17] = uStack_2068;
        local_668 = local_1f10 + 0x18;
        local_6a0 = local_20a0;
        uStack_698 = uStack_2098;
        uStack_690 = uStack_2090;
        uStack_688 = uStack_2088;
        *local_668 = local_20a0;
        local_1f10[0x19] = uStack_2098;
        local_1f10[0x1a] = uStack_2090;
        local_1f10[0x1b] = uStack_2088;
        local_6a8 = local_1f10 + 0x1c;
        local_6e0 = local_20c0;
        uStack_6d8 = uStack_20b8;
        uStack_6d0 = uStack_20b0;
        uStack_6c8 = uStack_20a8;
        *local_6a8 = local_20c0;
        local_1f10[0x1d] = uStack_20b8;
        local_1f10[0x1e] = uStack_20b0;
        local_1f10[0x1f] = uStack_20a8;
        local_1f68 = (undefined1 (*) [32])(*local_1f68 + (long)(local_1e8c << 3) * 4);
        local_1f10 = local_1f10 + 0x20;
        local_3e0 = local_4e0;
        uStack_3d8 = uStack_4d8;
        uStack_3d0 = uStack_4d0;
        uStack_3c8 = uStack_4c8;
        local_3c0 = local_4c0;
        uStack_3b8 = uStack_4b8;
        uStack_3b0 = uStack_4b0;
        uStack_3a8 = uStack_4a8;
        local_3a0 = local_4a0;
        uStack_398 = uStack_498;
        uStack_390 = uStack_490;
        uStack_388 = uStack_488;
        local_380 = local_480;
        uStack_378 = uStack_478;
        uStack_370 = uStack_470;
        uStack_368 = uStack_468;
        local_360 = local_460;
        uStack_358 = uStack_458;
        uStack_350 = uStack_450;
        uStack_348 = uStack_448;
        local_340 = local_440;
        uStack_338 = uStack_438;
        uStack_330 = uStack_430;
        uStack_328 = uStack_428;
        local_320 = local_420;
        uStack_318 = uStack_418;
        uStack_310 = uStack_410;
        uStack_308 = uStack_408;
        uStack_2e8 = uStack_3e8;
      }
      local_1ca0 = local_1e48;
      local_1f90 = local_2d8;
    }
    local_1c80 = local_1e58;
  }
  local_1efc = local_1ef8 * 8;
  for (local_20c4 = local_1efc; local_20c4 < local_1e8c; local_20c4 = local_20c4 + 1) {
    local_1be4 = local_20c4 / 8 + local_20c4 % 8;
    local_1bd8 = &local_2118;
    local_1be0 = &local_1ee8;
    local_1a8 = (undefined8 *)((long)local_1ee8 + local_1ea8 * local_1be4 * local_1ed8);
    local_190 = &local_2118;
    local_a8 = (long)local_1ebc * (long)local_1eb8 * local_1ed8;
    local_1b70 = &local_2118;
    local_1e38 = &local_2118;
    local_20f8 = local_1ec8;
    local_ac = 0x10;
    local_194 = local_1ebc;
    local_198 = local_1eb8;
    local_19c = local_1eb4;
    local_1b0 = local_1ed8;
    local_1b4 = local_1ed0;
    local_1c0 = local_1ec8;
    local_1be5 = 1;
    local_2118 = 0;
    local_2108 = 0;
    local_2100 = 0;
    local_20f0 = 0;
    local_20ec = 0;
    local_20e8 = 0;
    local_20e4 = 0;
    local_20e0 = 0;
    local_20d8 = 0;
    local_2110 = 0;
    local_20d0 = local_1a8;
    for (local_211c = 0; local_211c < local_1e94; local_211c = local_211c + 1) {
      local_1ac8 = &local_2170;
      local_274 = *(int *)((long)local_1e68 + 0x2c);
      local_278 = (int)local_1e68[6];
      local_27c = *(undefined4 *)((long)local_1e68 + 0x34);
      local_288 = *local_1e68 + local_1e68[8] * (long)local_211c * local_1e68[2];
      local_290 = local_1e68[2];
      local_294 = (undefined4)local_1e68[3];
      local_2a0 = local_1e68[4];
      local_270 = &local_2170;
      local_68 = (long)local_274 * (long)local_278 * local_290;
      local_1b50 = &local_2170;
      local_2128 = (undefined8 *)(local_288 + (long)(local_20c4 << 3) * 4);
      local_1e28 = &local_2170;
      local_6c = 0x10;
      local_1ad4 = local_211c;
      local_1ad5 = 1;
      local_2170 = 0;
      local_2160 = 0;
      local_2158 = 0;
      local_2148 = 0;
      local_2144 = 0;
      local_2140 = 0;
      local_213c = 0;
      local_2138 = 0;
      local_2130 = 0;
      local_2168 = 0;
      for (local_2174 = 0; local_2174 < local_1e90; local_2174 = local_2174 + 1) {
        local_9a8 = local_2128;
        local_21a0 = *local_2128;
        uStack_2198 = local_2128[1];
        uStack_2190 = local_2128[2];
        uStack_2188 = local_2128[3];
        local_6e8 = local_20d0;
        *local_20d0 = local_21a0;
        local_20d0[1] = uStack_2198;
        local_20d0[2] = uStack_2190;
        local_20d0[3] = uStack_2188;
        local_2128 = (undefined8 *)((long)local_2128 + (long)(local_1e8c << 3) * 4);
        local_20d0 = local_20d0 + 4;
        local_720 = local_21a0;
        uStack_718 = uStack_2198;
        uStack_710 = uStack_2190;
        uStack_708 = uStack_2188;
      }
      local_1ce0 = local_1e28;
      local_2150 = local_2a0;
    }
    local_1cc0 = local_1e38;
  }
  for (local_21a4 = 0; local_21a4 < local_1e98; local_21a4 = local_21a4 + 1) {
    local_1c08 = &local_21f8;
    local_15c = *(int *)((long)local_1e70 + 0x2c);
    local_160 = (int)local_1e70[6];
    local_164 = *(undefined4 *)((long)local_1e70 + 0x34);
    local_21b0 = (undefined8 *)(*local_1e70 + local_1e70[8] * (long)local_21a4 * local_1e70[2]);
    local_178 = local_1e70[2];
    local_17c = (undefined4)local_1e70[3];
    local_188 = local_1e70[4];
    local_158 = &local_21f8;
    local_b8 = (long)local_15c * (long)local_160 * local_178;
    local_1b78 = &local_21f8;
    local_1e18 = &local_21f8;
    local_bc = 0x10;
    local_1c14 = local_21a4;
    local_1c15 = 1;
    local_21f8 = 0;
    local_21e8 = 0;
    local_21e0 = 0;
    local_21d0 = 0;
    local_21cc = 0;
    local_21c8 = 0;
    local_21c4 = 0;
    local_21c0 = 0;
    local_21b8 = 0;
    local_21f0 = 0;
    local_1d00 = local_1e18;
    local_170 = local_21b0;
    local_21d8 = local_188;
    memset(local_2240,0,0x40);
    if (local_1ea0 == 0) {
      local_2b50 = (undefined1 (*) [64])local_2240;
    }
    else {
      local_2b50 = (undefined1 (*) [64])(local_1ea0 + (long)(local_21a4 << 4) * 4);
    }
    local_2248 = local_2b50;
    for (local_224c = 0; local_224c + 7 < local_1e8c; local_224c = local_224c + 8) {
      local_1c44 = local_224c / 8;
      local_1c38 = &local_22a0;
      local_1c40 = &local_1ee8;
      local_138 = (uint *)((long)local_1ee8 + local_1ea8 * local_1c44 * local_1ed8);
      local_120 = &local_22a0;
      local_c8 = (long)local_1ebc * (long)local_1eb8 * local_1ed8;
      local_1b80 = &local_22a0;
      local_1e08 = &local_22a0;
      local_2280 = local_1ec8;
      local_cc = 0x10;
      local_124 = local_1ebc;
      local_128 = local_1eb8;
      local_12c = local_1eb4;
      local_140 = local_1ed8;
      local_144 = local_1ed0;
      local_150 = local_1ec8;
      local_1c45 = 1;
      local_22a0 = 0;
      local_2290 = 0;
      local_2288 = 0;
      local_2274 = 0;
      local_2270 = 0;
      local_226c = 0;
      local_2268 = 0;
      local_2298 = 0;
      local_1af8 = &local_22f0;
      local_23c = *(int *)((long)local_1e78 + 0x2c);
      local_240 = (int)local_1e78[6];
      local_244 = *(undefined4 *)((long)local_1e78 + 0x34);
      local_250 = (undefined1 (*) [64])
                  (*local_1e78 + local_1e78[8] * (long)local_21a4 * local_1e78[2]);
      local_258 = local_1e78[2];
      local_25c = (undefined4)local_1e78[3];
      local_268 = local_1e78[4];
      local_238 = &local_22f0;
      local_78 = (long)local_23c * (long)local_240 * local_258;
      local_7c = 0x10;
      local_1b04 = local_21a4;
      local_1b05 = 1;
      local_2260 = 0;
      local_2278 = 0;
      local_1b58 = &local_22f0;
      local_1df8 = &local_22f0;
      local_22f0 = 0;
      local_22e0 = 0;
      local_22d8 = 0;
      local_22c8 = 0;
      local_22c4 = 0;
      local_22c0 = 0;
      local_22bc = 0;
      local_22b8 = 0;
      local_22b0 = 0;
      local_22e8 = 0;
      local_22f4 = local_1e94 * local_1e90 * 8;
      local_1988 = local_2b50;
      local_2380 = *local_2b50;
      local_2500 = *local_2b50;
      local_24c0 = *local_2b50;
      local_2480 = *local_2b50;
      local_2440 = *local_2b50;
      local_2400 = *local_2b50;
      local_23c0 = *local_2b50;
      local_2340 = *local_2b50;
      local_2504 = 0;
      local_22a8 = local_250;
      local_2258 = local_138;
      while( true ) {
        if (local_22f4 <= local_2504) break;
        local_e08 = local_22a8;
        local_2580 = *(undefined8 *)*local_22a8;
        uStack_2578 = *(undefined8 *)(*local_22a8 + 8);
        uStack_2570 = *(undefined8 *)(*local_22a8 + 0x10);
        uStack_2568 = *(undefined8 *)(*local_22a8 + 0x18);
        uStack_2560 = *(undefined8 *)(*local_22a8 + 0x20);
        uStack_2558 = *(undefined8 *)(*local_22a8 + 0x28);
        uStack_2550 = *(undefined8 *)(*local_22a8 + 0x30);
        uStack_2548 = *(undefined8 *)(*local_22a8 + 0x38);
        local_1504 = *local_2258;
        local_1580 = vbroadcastss_avx512f(ZEXT416(local_1504));
        local_25c0 = local_1580._0_8_;
        uStack_25b8 = local_1580._8_8_;
        uStack_25b0 = local_1580._16_8_;
        uStack_25a8 = local_1580._24_8_;
        uStack_25a0 = local_1580._32_8_;
        uStack_2598 = local_1580._40_8_;
        uStack_2590 = local_1580._48_8_;
        uStack_2588 = local_1580._56_8_;
        local_1584 = local_2258[1];
        local_1600 = vbroadcastss_avx512f(ZEXT416(local_1584));
        local_2600 = local_1600._0_8_;
        uStack_25f8 = local_1600._8_8_;
        uStack_25f0 = local_1600._16_8_;
        uStack_25e8 = local_1600._24_8_;
        uStack_25e0 = local_1600._32_8_;
        uStack_25d8 = local_1600._40_8_;
        uStack_25d0 = local_1600._48_8_;
        uStack_25c8 = local_1600._56_8_;
        local_1604 = local_2258[2];
        local_1680 = vbroadcastss_avx512f(ZEXT416(local_1604));
        local_2640 = local_1680._0_8_;
        uStack_2638 = local_1680._8_8_;
        uStack_2630 = local_1680._16_8_;
        uStack_2628 = local_1680._24_8_;
        uStack_2620 = local_1680._32_8_;
        uStack_2618 = local_1680._40_8_;
        uStack_2610 = local_1680._48_8_;
        uStack_2608 = local_1680._56_8_;
        local_1684 = local_2258[3];
        local_1700 = vbroadcastss_avx512f(ZEXT416(local_1684));
        local_2680 = local_1700._0_8_;
        uStack_2678 = local_1700._8_8_;
        uStack_2670 = local_1700._16_8_;
        uStack_2668 = local_1700._24_8_;
        uStack_2660 = local_1700._32_8_;
        uStack_2658 = local_1700._40_8_;
        uStack_2650 = local_1700._48_8_;
        uStack_2648 = local_1700._56_8_;
        local_1704 = local_2258[4];
        local_1780 = vbroadcastss_avx512f(ZEXT416(local_1704));
        local_26c0 = local_1780._0_8_;
        uStack_26b8 = local_1780._8_8_;
        uStack_26b0 = local_1780._16_8_;
        uStack_26a8 = local_1780._24_8_;
        uStack_26a0 = local_1780._32_8_;
        uStack_2698 = local_1780._40_8_;
        uStack_2690 = local_1780._48_8_;
        uStack_2688 = local_1780._56_8_;
        local_1784 = local_2258[5];
        local_1800 = vbroadcastss_avx512f(ZEXT416(local_1784));
        local_2700 = local_1800._0_8_;
        uStack_26f8 = local_1800._8_8_;
        uStack_26f0 = local_1800._16_8_;
        uStack_26e8 = local_1800._24_8_;
        uStack_26e0 = local_1800._32_8_;
        uStack_26d8 = local_1800._40_8_;
        uStack_26d0 = local_1800._48_8_;
        uStack_26c8 = local_1800._56_8_;
        local_1804 = local_2258[6];
        local_1880 = vbroadcastss_avx512f(ZEXT416(local_1804));
        local_2740 = local_1880._0_8_;
        uStack_2738 = local_1880._8_8_;
        uStack_2730 = local_1880._16_8_;
        uStack_2728 = local_1880._24_8_;
        uStack_2720 = local_1880._32_8_;
        uStack_2718 = local_1880._40_8_;
        uStack_2710 = local_1880._48_8_;
        uStack_2708 = local_1880._56_8_;
        local_1884 = local_2258[7];
        local_1900 = vbroadcastss_avx512f(ZEXT416(local_1884));
        local_2780 = local_1900._0_8_;
        uStack_2778 = local_1900._8_8_;
        uStack_2770 = local_1900._16_8_;
        uStack_2768 = local_1900._24_8_;
        uStack_2760 = local_1900._32_8_;
        uStack_2758 = local_1900._40_8_;
        uStack_2750 = local_1900._48_8_;
        uStack_2748 = local_1900._56_8_;
        local_e80 = local_1580._0_8_;
        uStack_e78 = local_1580._8_8_;
        uStack_e70 = local_1580._16_8_;
        uStack_e68 = local_1580._24_8_;
        uStack_e60 = local_1580._32_8_;
        uStack_e58 = local_1580._40_8_;
        uStack_e50 = local_1580._48_8_;
        uStack_e48 = local_1580._56_8_;
        local_f00 = local_2340._0_8_;
        uStack_ef8 = local_2340._8_8_;
        uStack_ef0 = local_2340._16_8_;
        uStack_ee8 = local_2340._24_8_;
        uStack_ee0 = local_2340._32_8_;
        uStack_ed8 = local_2340._40_8_;
        uStack_ed0 = local_2340._48_8_;
        uStack_ec8 = local_2340._56_8_;
        local_2340 = vfmadd213ps_avx512f(*local_22a8,local_1580,local_2340);
        local_f40 = local_1600._0_8_;
        uStack_f38 = local_1600._8_8_;
        uStack_f30 = local_1600._16_8_;
        uStack_f28 = local_1600._24_8_;
        uStack_f20 = local_1600._32_8_;
        uStack_f18 = local_1600._40_8_;
        uStack_f10 = local_1600._48_8_;
        uStack_f08 = local_1600._56_8_;
        local_fc0 = local_2380._0_8_;
        uStack_fb8 = local_2380._8_8_;
        uStack_fb0 = local_2380._16_8_;
        uStack_fa8 = local_2380._24_8_;
        uStack_fa0 = local_2380._32_8_;
        uStack_f98 = local_2380._40_8_;
        uStack_f90 = local_2380._48_8_;
        uStack_f88 = local_2380._56_8_;
        local_2380 = vfmadd213ps_avx512f(*local_22a8,local_1600,local_2380);
        local_1000 = local_1680._0_8_;
        uStack_ff8 = local_1680._8_8_;
        uStack_ff0 = local_1680._16_8_;
        uStack_fe8 = local_1680._24_8_;
        uStack_fe0 = local_1680._32_8_;
        uStack_fd8 = local_1680._40_8_;
        uStack_fd0 = local_1680._48_8_;
        uStack_fc8 = local_1680._56_8_;
        local_1080 = local_23c0._0_8_;
        uStack_1078 = local_23c0._8_8_;
        uStack_1070 = local_23c0._16_8_;
        uStack_1068 = local_23c0._24_8_;
        uStack_1060 = local_23c0._32_8_;
        uStack_1058 = local_23c0._40_8_;
        uStack_1050 = local_23c0._48_8_;
        uStack_1048 = local_23c0._56_8_;
        local_23c0 = vfmadd213ps_avx512f(*local_22a8,local_1680,local_23c0);
        local_10c0 = local_1700._0_8_;
        uStack_10b8 = local_1700._8_8_;
        uStack_10b0 = local_1700._16_8_;
        uStack_10a8 = local_1700._24_8_;
        uStack_10a0 = local_1700._32_8_;
        uStack_1098 = local_1700._40_8_;
        uStack_1090 = local_1700._48_8_;
        uStack_1088 = local_1700._56_8_;
        local_1140 = local_2400._0_8_;
        uStack_1138 = local_2400._8_8_;
        uStack_1130 = local_2400._16_8_;
        uStack_1128 = local_2400._24_8_;
        uStack_1120 = local_2400._32_8_;
        uStack_1118 = local_2400._40_8_;
        uStack_1110 = local_2400._48_8_;
        uStack_1108 = local_2400._56_8_;
        local_2400 = vfmadd213ps_avx512f(*local_22a8,local_1700,local_2400);
        local_1180 = local_1780._0_8_;
        uStack_1178 = local_1780._8_8_;
        uStack_1170 = local_1780._16_8_;
        uStack_1168 = local_1780._24_8_;
        uStack_1160 = local_1780._32_8_;
        uStack_1158 = local_1780._40_8_;
        uStack_1150 = local_1780._48_8_;
        uStack_1148 = local_1780._56_8_;
        local_1200 = local_2440._0_8_;
        uStack_11f8 = local_2440._8_8_;
        uStack_11f0 = local_2440._16_8_;
        uStack_11e8 = local_2440._24_8_;
        uStack_11e0 = local_2440._32_8_;
        uStack_11d8 = local_2440._40_8_;
        uStack_11d0 = local_2440._48_8_;
        uStack_11c8 = local_2440._56_8_;
        local_2440 = vfmadd213ps_avx512f(*local_22a8,local_1780,local_2440);
        local_1240 = local_1800._0_8_;
        uStack_1238 = local_1800._8_8_;
        uStack_1230 = local_1800._16_8_;
        uStack_1228 = local_1800._24_8_;
        uStack_1220 = local_1800._32_8_;
        uStack_1218 = local_1800._40_8_;
        uStack_1210 = local_1800._48_8_;
        uStack_1208 = local_1800._56_8_;
        local_12c0 = local_2480._0_8_;
        uStack_12b8 = local_2480._8_8_;
        uStack_12b0 = local_2480._16_8_;
        uStack_12a8 = local_2480._24_8_;
        uStack_12a0 = local_2480._32_8_;
        uStack_1298 = local_2480._40_8_;
        uStack_1290 = local_2480._48_8_;
        uStack_1288 = local_2480._56_8_;
        local_2480 = vfmadd213ps_avx512f(*local_22a8,local_1800,local_2480);
        local_1300 = local_1880._0_8_;
        uStack_12f8 = local_1880._8_8_;
        uStack_12f0 = local_1880._16_8_;
        uStack_12e8 = local_1880._24_8_;
        uStack_12e0 = local_1880._32_8_;
        uStack_12d8 = local_1880._40_8_;
        uStack_12d0 = local_1880._48_8_;
        uStack_12c8 = local_1880._56_8_;
        local_1380 = local_24c0._0_8_;
        uStack_1378 = local_24c0._8_8_;
        uStack_1370 = local_24c0._16_8_;
        uStack_1368 = local_24c0._24_8_;
        uStack_1360 = local_24c0._32_8_;
        uStack_1358 = local_24c0._40_8_;
        uStack_1350 = local_24c0._48_8_;
        uStack_1348 = local_24c0._56_8_;
        local_24c0 = vfmadd213ps_avx512f(*local_22a8,local_1880,local_24c0);
        local_13c0 = local_1900._0_8_;
        uStack_13b8 = local_1900._8_8_;
        uStack_13b0 = local_1900._16_8_;
        uStack_13a8 = local_1900._24_8_;
        uStack_13a0 = local_1900._32_8_;
        uStack_1398 = local_1900._40_8_;
        uStack_1390 = local_1900._48_8_;
        uStack_1388 = local_1900._56_8_;
        local_1440 = local_2500._0_8_;
        uStack_1438 = local_2500._8_8_;
        uStack_1430 = local_2500._16_8_;
        uStack_1428 = local_2500._24_8_;
        uStack_1420 = local_2500._32_8_;
        uStack_1418 = local_2500._40_8_;
        uStack_1410 = local_2500._48_8_;
        uStack_1408 = local_2500._56_8_;
        local_2500 = vfmadd213ps_avx512f(*local_22a8,local_1900,local_2500);
        local_22a8 = local_22a8 + 1;
        local_2258 = local_2258 + 8;
        local_2504 = local_2504 + 1;
        local_1400 = local_2580;
        uStack_13f8 = uStack_2578;
        uStack_13f0 = uStack_2570;
        uStack_13e8 = uStack_2568;
        uStack_13e0 = uStack_2560;
        uStack_13d8 = uStack_2558;
        uStack_13d0 = uStack_2550;
        uStack_13c8 = uStack_2548;
        local_1340 = local_2580;
        uStack_1338 = uStack_2578;
        uStack_1330 = uStack_2570;
        uStack_1328 = uStack_2568;
        uStack_1320 = uStack_2560;
        uStack_1318 = uStack_2558;
        uStack_1310 = uStack_2550;
        uStack_1308 = uStack_2548;
        local_1280 = local_2580;
        uStack_1278 = uStack_2578;
        uStack_1270 = uStack_2570;
        uStack_1268 = uStack_2568;
        uStack_1260 = uStack_2560;
        uStack_1258 = uStack_2558;
        uStack_1250 = uStack_2550;
        uStack_1248 = uStack_2548;
        local_11c0 = local_2580;
        uStack_11b8 = uStack_2578;
        uStack_11b0 = uStack_2570;
        uStack_11a8 = uStack_2568;
        uStack_11a0 = uStack_2560;
        uStack_1198 = uStack_2558;
        uStack_1190 = uStack_2550;
        uStack_1188 = uStack_2548;
        local_1100 = local_2580;
        uStack_10f8 = uStack_2578;
        uStack_10f0 = uStack_2570;
        uStack_10e8 = uStack_2568;
        uStack_10e0 = uStack_2560;
        uStack_10d8 = uStack_2558;
        uStack_10d0 = uStack_2550;
        uStack_10c8 = uStack_2548;
        local_1040 = local_2580;
        uStack_1038 = uStack_2578;
        uStack_1030 = uStack_2570;
        uStack_1028 = uStack_2568;
        uStack_1020 = uStack_2560;
        uStack_1018 = uStack_2558;
        uStack_1010 = uStack_2550;
        uStack_1008 = uStack_2548;
        local_f80 = local_2580;
        uStack_f78 = uStack_2578;
        uStack_f70 = uStack_2570;
        uStack_f68 = uStack_2568;
        uStack_f60 = uStack_2560;
        uStack_f58 = uStack_2558;
        uStack_f50 = uStack_2550;
        uStack_f48 = uStack_2548;
        local_ec0 = local_2580;
        uStack_eb8 = uStack_2578;
        uStack_eb0 = uStack_2570;
        uStack_ea8 = uStack_2568;
        uStack_ea0 = uStack_2560;
        uStack_e98 = uStack_2558;
        uStack_e90 = uStack_2550;
        uStack_e88 = uStack_2548;
      }
      local_9b0 = local_21b0;
      local_a00 = local_2340._0_8_;
      uStack_9f8 = local_2340._8_8_;
      uStack_9f0 = local_2340._16_8_;
      uStack_9e8 = local_2340._24_8_;
      uStack_9e0 = local_2340._32_8_;
      uStack_9d8 = local_2340._40_8_;
      uStack_9d0 = local_2340._48_8_;
      uStack_9c8 = local_2340._56_8_;
      *local_21b0 = local_2340._0_8_;
      local_21b0[1] = local_2340._8_8_;
      local_21b0[2] = local_2340._16_8_;
      local_21b0[3] = local_2340._24_8_;
      local_21b0[4] = local_2340._32_8_;
      local_21b0[5] = local_2340._40_8_;
      local_21b0[6] = local_2340._48_8_;
      local_21b0[7] = local_2340._56_8_;
      local_a08 = local_21b0 + 8;
      local_a80 = local_2380._0_8_;
      uStack_a78 = local_2380._8_8_;
      uStack_a70 = local_2380._16_8_;
      uStack_a68 = local_2380._24_8_;
      uStack_a60 = local_2380._32_8_;
      uStack_a58 = local_2380._40_8_;
      uStack_a50 = local_2380._48_8_;
      uStack_a48 = local_2380._56_8_;
      *local_a08 = local_2380._0_8_;
      local_21b0[9] = local_2380._8_8_;
      local_21b0[10] = local_2380._16_8_;
      local_21b0[0xb] = local_2380._24_8_;
      local_21b0[0xc] = local_2380._32_8_;
      local_21b0[0xd] = local_2380._40_8_;
      local_21b0[0xe] = local_2380._48_8_;
      local_21b0[0xf] = local_2380._56_8_;
      local_a88 = local_21b0 + 0x10;
      local_b00 = local_23c0._0_8_;
      uStack_af8 = local_23c0._8_8_;
      uStack_af0 = local_23c0._16_8_;
      uStack_ae8 = local_23c0._24_8_;
      uStack_ae0 = local_23c0._32_8_;
      uStack_ad8 = local_23c0._40_8_;
      uStack_ad0 = local_23c0._48_8_;
      uStack_ac8 = local_23c0._56_8_;
      *local_a88 = local_23c0._0_8_;
      local_21b0[0x11] = local_23c0._8_8_;
      local_21b0[0x12] = local_23c0._16_8_;
      local_21b0[0x13] = local_23c0._24_8_;
      local_21b0[0x14] = local_23c0._32_8_;
      local_21b0[0x15] = local_23c0._40_8_;
      local_21b0[0x16] = local_23c0._48_8_;
      local_21b0[0x17] = local_23c0._56_8_;
      local_b08 = local_21b0 + 0x18;
      local_b80 = local_2400._0_8_;
      uStack_b78 = local_2400._8_8_;
      uStack_b70 = local_2400._16_8_;
      uStack_b68 = local_2400._24_8_;
      uStack_b60 = local_2400._32_8_;
      uStack_b58 = local_2400._40_8_;
      uStack_b50 = local_2400._48_8_;
      uStack_b48 = local_2400._56_8_;
      *local_b08 = local_2400._0_8_;
      local_21b0[0x19] = local_2400._8_8_;
      local_21b0[0x1a] = local_2400._16_8_;
      local_21b0[0x1b] = local_2400._24_8_;
      local_21b0[0x1c] = local_2400._32_8_;
      local_21b0[0x1d] = local_2400._40_8_;
      local_21b0[0x1e] = local_2400._48_8_;
      local_21b0[0x1f] = local_2400._56_8_;
      local_b88 = local_21b0 + 0x20;
      local_c00 = local_2440._0_8_;
      uStack_bf8 = local_2440._8_8_;
      uStack_bf0 = local_2440._16_8_;
      uStack_be8 = local_2440._24_8_;
      uStack_be0 = local_2440._32_8_;
      uStack_bd8 = local_2440._40_8_;
      uStack_bd0 = local_2440._48_8_;
      uStack_bc8 = local_2440._56_8_;
      *local_b88 = local_2440._0_8_;
      local_21b0[0x21] = local_2440._8_8_;
      local_21b0[0x22] = local_2440._16_8_;
      local_21b0[0x23] = local_2440._24_8_;
      local_21b0[0x24] = local_2440._32_8_;
      local_21b0[0x25] = local_2440._40_8_;
      local_21b0[0x26] = local_2440._48_8_;
      local_21b0[0x27] = local_2440._56_8_;
      local_c08 = local_21b0 + 0x28;
      local_c80 = local_2480._0_8_;
      uStack_c78 = local_2480._8_8_;
      uStack_c70 = local_2480._16_8_;
      uStack_c68 = local_2480._24_8_;
      uStack_c60 = local_2480._32_8_;
      uStack_c58 = local_2480._40_8_;
      uStack_c50 = local_2480._48_8_;
      uStack_c48 = local_2480._56_8_;
      *local_c08 = local_2480._0_8_;
      local_21b0[0x29] = local_2480._8_8_;
      local_21b0[0x2a] = local_2480._16_8_;
      local_21b0[0x2b] = local_2480._24_8_;
      local_21b0[0x2c] = local_2480._32_8_;
      local_21b0[0x2d] = local_2480._40_8_;
      local_21b0[0x2e] = local_2480._48_8_;
      local_21b0[0x2f] = local_2480._56_8_;
      local_c88 = local_21b0 + 0x30;
      local_d00 = local_24c0._0_8_;
      uStack_cf8 = local_24c0._8_8_;
      uStack_cf0 = local_24c0._16_8_;
      uStack_ce8 = local_24c0._24_8_;
      uStack_ce0 = local_24c0._32_8_;
      uStack_cd8 = local_24c0._40_8_;
      uStack_cd0 = local_24c0._48_8_;
      uStack_cc8 = local_24c0._56_8_;
      *local_c88 = local_24c0._0_8_;
      local_21b0[0x31] = local_24c0._8_8_;
      local_21b0[0x32] = local_24c0._16_8_;
      local_21b0[0x33] = local_24c0._24_8_;
      local_21b0[0x34] = local_24c0._32_8_;
      local_21b0[0x35] = local_24c0._40_8_;
      local_21b0[0x36] = local_24c0._48_8_;
      local_21b0[0x37] = local_24c0._56_8_;
      local_d08 = local_21b0 + 0x38;
      local_d80 = local_2500._0_8_;
      uStack_d78 = local_2500._8_8_;
      uStack_d70 = local_2500._16_8_;
      uStack_d68 = local_2500._24_8_;
      uStack_d60 = local_2500._32_8_;
      uStack_d58 = local_2500._40_8_;
      uStack_d50 = local_2500._48_8_;
      uStack_d48 = local_2500._56_8_;
      *local_d08 = local_2500._0_8_;
      local_21b0[0x39] = local_2500._8_8_;
      local_21b0[0x3a] = local_2500._16_8_;
      local_21b0[0x3b] = local_2500._24_8_;
      local_21b0[0x3c] = local_2500._32_8_;
      local_21b0[0x3d] = local_2500._40_8_;
      local_21b0[0x3e] = local_2500._48_8_;
      local_21b0[0x3f] = local_2500._56_8_;
      local_21b0 = local_21b0 + 0x40;
      local_1d40 = local_1df8;
      local_1d20 = local_1e08;
      local_22d0 = local_268;
    }
    for (; local_224c < local_1e8c; local_224c = local_224c + 1) {
      local_1c74 = local_224c / 8 + local_224c % 8;
      local_1c68 = &local_27d0;
      local_1c70 = &local_1ee8;
      local_100 = (uint *)((long)local_1ee8 + local_1ea8 * local_1c74 * local_1ed8);
      local_e8 = &local_27d0;
      local_d8 = (long)local_1ebc * (long)local_1eb8 * local_1ed8;
      local_1b88 = &local_27d0;
      local_1de8 = &local_27d0;
      local_27b0 = local_1ec8;
      local_dc = 0x10;
      local_ec = local_1ebc;
      local_f0 = local_1eb8;
      local_f4 = local_1eb4;
      local_108 = local_1ed8;
      local_10c = local_1ed0;
      local_118 = local_1ec8;
      local_1c75 = 1;
      local_1b28 = &local_2820;
      local_204 = *(int *)((long)local_1e78 + 0x2c);
      local_208 = (int)local_1e78[6];
      local_20c = *(undefined4 *)((long)local_1e78 + 0x34);
      local_218 = (undefined1 (*) [64])
                  (*local_1e78 + local_1e78[8] * (long)local_21a4 * local_1e78[2]);
      local_220 = local_1e78[2];
      local_224 = (undefined4)local_1e78[3];
      local_230 = local_1e78[4];
      local_200 = &local_2820;
      local_88 = (long)local_204 * (long)local_208 * local_220;
      local_2798 = 0;
      local_279c = 0;
      local_27a0 = 0;
      local_27a4 = 0;
      local_27b8 = 0;
      local_27c0 = 0;
      local_27c8 = 0;
      local_27d0 = 0;
      local_8c = 0x10;
      local_1b34 = local_21a4;
      local_1b35 = 1;
      local_2790 = 0;
      local_27a8 = 0;
      local_1b60 = &local_2820;
      local_1dd8 = &local_2820;
      local_2820 = 0;
      local_2810 = 0;
      local_2808 = 0;
      local_27f8 = 0;
      local_27f4 = 0;
      local_27f0 = 0;
      local_27ec = 0;
      local_27e8 = 0;
      local_27e0 = 0;
      local_2818 = 0;
      local_1990 = local_2b50;
      local_2880 = *local_2b50;
      local_2884 = 0;
      local_27d8 = local_218;
      local_2788 = local_100;
      while( true ) {
        if (local_1e94 * local_1e90 * 8 <= local_2884) break;
        local_e10 = local_27d8;
        local_14c0 = *(undefined8 *)*local_27d8;
        uStack_14b8 = *(undefined8 *)(*local_27d8 + 8);
        uStack_14b0 = *(undefined8 *)(*local_27d8 + 0x10);
        uStack_14a8 = *(undefined8 *)(*local_27d8 + 0x18);
        uStack_14a0 = *(undefined8 *)(*local_27d8 + 0x20);
        uStack_1498 = *(undefined8 *)(*local_27d8 + 0x28);
        uStack_1490 = *(undefined8 *)(*local_27d8 + 0x30);
        uStack_1488 = *(undefined8 *)(*local_27d8 + 0x38);
        local_1904 = *local_2788;
        local_1980 = vbroadcastss_avx512f(ZEXT416(local_1904));
        local_1480 = local_1980._0_8_;
        uStack_1478 = local_1980._8_8_;
        uStack_1470 = local_1980._16_8_;
        uStack_1468 = local_1980._24_8_;
        uStack_1460 = local_1980._32_8_;
        uStack_1458 = local_1980._40_8_;
        uStack_1450 = local_1980._48_8_;
        uStack_1448 = local_1980._56_8_;
        local_1500 = local_2880._0_8_;
        uStack_14f8 = local_2880._8_8_;
        uStack_14f0 = local_2880._16_8_;
        uStack_14e8 = local_2880._24_8_;
        uStack_14e0 = local_2880._32_8_;
        uStack_14d8 = local_2880._40_8_;
        uStack_14d0 = local_2880._48_8_;
        uStack_14c8 = local_2880._56_8_;
        local_2880 = vfmadd213ps_avx512f(*local_27d8,local_1980,local_2880);
        local_27d8 = local_27d8 + 1;
        local_2788 = local_2788 + 1;
        local_2884 = local_2884 + 1;
      }
      local_d88 = local_21b0;
      local_e00 = local_2880._0_8_;
      uStack_df8 = local_2880._8_8_;
      uStack_df0 = local_2880._16_8_;
      uStack_de8 = local_2880._24_8_;
      uStack_de0 = local_2880._32_8_;
      uStack_dd8 = local_2880._40_8_;
      uStack_dd0 = local_2880._48_8_;
      uStack_dc8 = local_2880._56_8_;
      *local_21b0 = local_2880._0_8_;
      local_21b0[1] = local_2880._8_8_;
      local_21b0[2] = local_2880._16_8_;
      local_21b0[3] = local_2880._24_8_;
      local_21b0[4] = local_2880._32_8_;
      local_21b0[5] = local_2880._40_8_;
      local_21b0[6] = local_2880._48_8_;
      local_21b0[7] = local_2880._56_8_;
      local_21b0 = local_21b0 + 8;
      local_1d80 = local_1dd8;
      local_1d60 = local_1de8;
      local_2800 = local_230;
    }
  }
  local_1dc8 = &local_1ee8;
  if (local_1ee0 != (int *)0x0) {
    local_1da4 = 0xffffffff;
    LOCK();
    local_1da8 = *local_1ee0;
    *local_1ee0 = *local_1ee0 + -1;
    UNLOCK();
    if (local_1da8 == 1) {
      local_1da0 = local_1dc8;
      if (local_1ec8 == (long *)0x0) {
        local_19a0 = local_1ee8;
        if (local_1ee8 != (void *)0x0) {
          free(local_1ee8);
        }
      }
      else {
        (**(code **)(*local_1ec8 + 0x18))(local_1ec8,local_1ee8);
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to16_avx512(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 32u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 32u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 32u, 8, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 8x8
                    __m256 _r0 = _mm256_load_ps(img0);
                    __m256 _r1 = _mm256_load_ps(img0 + 8);
                    __m256 _r2 = _mm256_load_ps(img0 + 8 * 2);
                    __m256 _r3 = _mm256_load_ps(img0 + 8 * 3);
                    __m256 _r4 = _mm256_load_ps(img0 + 8 * 4);
                    __m256 _r5 = _mm256_load_ps(img0 + 8 * 5);
                    __m256 _r6 = _mm256_load_ps(img0 + 8 * 6);
                    __m256 _r7 = _mm256_load_ps(img0 + 8 * 7);

                    transpose8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);

                    _mm256_store_ps(tmpptr, _r0);
                    _mm256_store_ps(tmpptr + 8, _r1);
                    _mm256_store_ps(tmpptr + 8 * 2, _r2);
                    _mm256_store_ps(tmpptr + 8 * 3, _r3);
                    _mm256_store_ps(tmpptr + 8 * 4, _r4);
                    _mm256_store_ps(tmpptr + 8 * 5, _r5);
                    _mm256_store_ps(tmpptr + 8 * 6, _r6);
                    _mm256_store_ps(tmpptr + 8 * 7, _r7);

                    img0 += size * 8;
                    tmpptr += 64;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 8;

                for (int k = 0; k < maxk; k++)
                {
                    __m256 _val = _mm256_load_ps(img0);
                    _mm256_store_ps(tmpptr, _val);

                    img0 += size * 8;
                    tmpptr += 8;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[16] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 16 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);
            __m512 _sum1 = _sum0;
            __m512 _sum2 = _sum0;
            __m512 _sum3 = _sum0;
            __m512 _sum4 = _sum0;
            __m512 _sum5 = _sum0;
            __m512 _sum6 = _sum0;
            __m512 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);

                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                __m512 _val1 = _mm512_set1_ps(tmpptr[1]);
                __m512 _val2 = _mm512_set1_ps(tmpptr[2]);
                __m512 _val3 = _mm512_set1_ps(tmpptr[3]);
                __m512 _val4 = _mm512_set1_ps(tmpptr[4]);
                __m512 _val5 = _mm512_set1_ps(tmpptr[5]);
                __m512 _val6 = _mm512_set1_ps(tmpptr[6]);
                __m512 _val7 = _mm512_set1_ps(tmpptr[7]);

                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm512_fmadd_ps(_val1, _w0, _sum1);
                _sum2 = _mm512_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm512_fmadd_ps(_val3, _w0, _sum3);
                _sum4 = _mm512_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm512_fmadd_ps(_val5, _w0, _sum5);
                _sum6 = _mm512_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm512_fmadd_ps(_val7, _w0, _sum7);

                kptr += 16;
                tmpptr += 8;
            }

            _mm512_store_ps(outptr0, _sum0);
            _mm512_store_ps(outptr0 + 16, _sum1);
            _mm512_store_ps(outptr0 + 16 * 2, _sum2);
            _mm512_store_ps(outptr0 + 16 * 3, _sum3);
            _mm512_store_ps(outptr0 + 16 * 4, _sum4);
            _mm512_store_ps(outptr0 + 16 * 5, _sum5);
            _mm512_store_ps(outptr0 + 16 * 6, _sum6);
            _mm512_store_ps(outptr0 + 16 * 7, _sum7);

            outptr0 += 16 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 8; // inch always > 0

            __m512 _sum0 = _mm512_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m512 _w0 = _mm512_load_ps(kptr);
                __m512 _val0 = _mm512_set1_ps(tmpptr[0]);
                _sum0 = _mm512_fmadd_ps(_val0, _w0, _sum0);

                kptr += 16;
                tmpptr += 1;
            }

            _mm512_store_ps(outptr0, _sum0);
            outptr0 += 16;
        }
    }
}